

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::
GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
          (java *this,string *package_dir,string *java_package,Descriptor *descriptor,
          GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,bool annotate_code,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_list,string *name_suffix,MessageGenerator *generator,
          offset_in_MessageGenerator_to_subr pfn)

{
  ZeroCopyOutputStream *pZVar1;
  long *plVar2;
  AnnotationCollector *pAVar3;
  undefined7 in_stack_00000009;
  undefined1 local_168 [8];
  Printer printer;
  undefined1 local_c8 [8];
  GeneratedCodeInfo annotations;
  undefined1 local_98 [8];
  string info_full_path;
  string filename;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (java_package->_M_dataplus)._M_p);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 annotation_list);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&info_full_path.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 ".java");
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)context,(value_type *)((long)&info_full_path.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&info_full_path.field_2 + 8),".pb.meta");
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_c8);
  filename.field_2._8_8_ = &PTR_AddAnnotation_0031a2f8;
  pZVar1 = (ZeroCopyOutputStream *)
           (**(code **)(*(long *)descriptor + 0x10))
                     (descriptor,(undefined1 *)((long)&info_full_path.field_2 + 8));
  pAVar3 = (AnnotationCollector *)((long)&filename.field_2 + 8);
  if ((char)file_list == '\0') {
    pAVar3 = (AnnotationCollector *)0x0;
  }
  google::protobuf::io::Printer::Printer((Printer *)local_168,pZVar1,'$',pAVar3);
  io::Printer::Print<char[9],std::__cxx11::string>
            ((Printer *)local_168,
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
             ,(char (*) [9])"filename",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             **(undefined8 **)&java_package->field_2);
  if (package_dir->_M_string_length != 0) {
    io::Printer::Print<char[8],std::__cxx11::string>
              ((Printer *)local_168,"package $package$;\n\n",(char (*) [8])0x2ac554,package_dir);
  }
  plVar2 = (long *)((long)&(name_suffix->_M_dataplus)._M_p + pfn);
  if (((ulong)generator & 1) != 0) {
    generator = *(MessageGenerator **)(*plVar2 + -1 + (long)generator);
  }
  (*(code *)generator)(plVar2,local_168);
  if ((char)file_list != '\0') {
    plVar2 = (long *)(**(code **)(*(long *)descriptor + 0x10))(descriptor,local_98);
    google::protobuf::MessageLite::SerializeToZeroCopyStream((ZeroCopyOutputStream *)local_c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT71(in_stack_00000009,annotate_code),(value_type *)local_98);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))(plVar2);
    }
  }
  google::protobuf::io::Printer::~Printer((Printer *)local_168);
  if (pZVar1 != (ZeroCopyOutputStream *)0x0) {
    (**(code **)(*(long *)pZVar1 + 8))(pZVar1);
  }
  google::protobuf::GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_c8);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)(info_full_path.field_2._M_local_buf + 8));
  return;
}

Assistant:

static void GenerateSibling(
    const std::string& package_dir, const std::string& java_package,
    const DescriptorClass* descriptor, GeneratorContext* context,
    std::vector<std::string>* file_list, bool annotate_code,
    std::vector<std::string>* annotation_list, const std::string& name_suffix,
    GeneratorClass* generator,
    void (GeneratorClass::*pfn)(io::Printer* printer)) {
  std::string filename =
      package_dir + descriptor->name() + name_suffix + ".java";
  file_list->push_back(filename);
  std::string info_full_path = filename + ".pb.meta";
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);

  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  io::Printer printer(output.get(), '$',
                      annotate_code ? &annotation_collector : NULL);

  printer.Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n",
      "filename", descriptor->file()->name());
  if (!java_package.empty()) {
    printer.Print(
        "package $package$;\n"
        "\n",
        "package", java_package);
  }

  (generator->*pfn)(&printer);

  if (annotate_code) {
    std::unique_ptr<io::ZeroCopyOutputStream> info_output(
        context->Open(info_full_path));
    annotations.SerializeToZeroCopyStream(info_output.get());
    annotation_list->push_back(info_full_path);
  }
}